

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::RenderDeviceGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator=
          (RefCntAutoPtr<Diligent::RenderDeviceGLImpl> *this,RenderDeviceGLImpl *pObj)

{
  RenderDeviceGLImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (RenderDeviceGLImpl *)0x0) {
      RefCountedObject<Diligent::IRenderDeviceGL>::Release
                ((RefCountedObject<Diligent::IRenderDeviceGL> *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (RenderDeviceGLImpl *)0x0) {
      RefCountedObject<Diligent::IRenderDeviceGL>::AddRef
                ((RefCountedObject<Diligent::IRenderDeviceGL> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }